

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds.cpp
# Opt level: O0

int main(void)

{
  __array __n;
  pointer piVar1;
  pointer piVar2;
  int local_80 [4];
  ostream_iterator<int,_char,_std::char_traits<char>_> local_70;
  istream_iterator<int,_char,_std::char_traits<char>,_long> local_60;
  undefined1 local_50 [8];
  ostream_iterator<int,_char,_std::char_traits<char>_> printer;
  undefined1 local_30 [8];
  istream_iterator<int,_char,_std::char_traits<char>,_long> reader;
  __array array;
  size_t n;
  
  std::istream::operator>>((istream *)&std::cin,(ulong *)&array);
  std::make_unique<int[]>((size_t)&reader._M_value);
  std::istream_iterator<int,_char,_std::char_traits<char>,_long>::istream_iterator
            ((istream_iterator<int,_char,_std::char_traits<char>,_long> *)local_30,
             (istream_type *)&std::cin);
  std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
            ((ostream_iterator<int,_char,_std::char_traits<char>_> *)local_50,
             (ostream_type *)&std::cout,"\n");
  std::istream_iterator<int,_char,_std::char_traits<char>,_long>::istream_iterator
            (&local_60,(istream_iterator<int,_char,_std::char_traits<char>,_long> *)local_30);
  __n = array;
  piVar1 = std::unique_ptr<int[],_std::default_delete<int[]>_>::get
                     ((unique_ptr<int[],_std::default_delete<int[]>_> *)&reader._M_value);
  std::copy_n<std::istream_iterator<int,char,std::char_traits<char>,long>,unsigned_long,int*>
            (&local_60,
             (unsigned_long)
             __n._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl,piVar1);
  piVar1 = std::unique_ptr<int[],_std::default_delete<int[]>_>::get
                     ((unique_ptr<int[],_std::default_delete<int[]>_> *)&reader._M_value);
  piVar2 = std::unique_ptr<int[],_std::default_delete<int[]>_>::get
                     ((unique_ptr<int[],_std::default_delete<int[]>_> *)&reader._M_value);
  std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
            (&local_70,(ostream_iterator<int,_char,_std::char_traits<char>_> *)local_50);
  std::reverse_copy<int*,std::ostream_iterator<int,char,std::char_traits<char>>>
            (local_80,piVar1,
             (ostream_iterator<int,_char,_std::char_traits<char>_> *)
             (piVar2 + (long)array._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t
                             .super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                             super__Head_base<0UL,_int_*,_false>._M_head_impl));
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)&reader._M_value);
  return 0;
}

Assistant:

int main() {
  size_t n;
  std::cin >> n;
  auto array = std::make_unique<int[]>(n);
  auto reader = std::istream_iterator<int>(std::cin);
  auto printer = std::ostream_iterator<int>(std::cout, "\n");
  std::copy_n(reader, n, array.get());
  std::reverse_copy(array.get(), array.get() + n, printer);
  return 0;
}